

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# private_impl.cpp
# Opt level: O2

void __thiscall raspicam::_private::Private_Impl::setRotation(Private_Impl *this,int rotation)

{
  uint uVar1;
  uint uVar2;
  int iVar3;
  
  iVar3 = 0;
  if (0 < rotation) {
    iVar3 = rotation;
  }
  uVar1 = ((uint)((iVar3 + (rotation >> 0x1f)) - rotation) / 0x168 - (rotation >> 0x1f)) * 0x168 +
          rotation;
  uVar2 = uVar1 % 0x168;
  if (uVar1 < 0x168) {
    uVar2 = uVar1;
  }
  (this->State).rotation = uVar2;
  if (this->_isOpened == true) {
    iVar3 = (this->State).rotation;
    iVar3 = iVar3 - iVar3 % 0x5a;
    mmal_port_parameter_set_int32(*((this->State).camera_component)->output,0x10002,iVar3);
    mmal_port_parameter_set_int32(((this->State).camera_component)->output[1],0x10002,iVar3);
    mmal_port_parameter_set_int32(((this->State).camera_component)->output[2],0x10002,iVar3);
    return;
  }
  return;
}

Assistant:

void Private_Impl::setRotation ( int rotation ) {
            while ( rotation < 0 )
                rotation += 360;
            if ( rotation >= 360 )
                rotation = rotation % 360;
            State.rotation = rotation;
            if ( isOpened() ) commitRotation();
        }